

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O0

_Bool IoTHubClientCore_LL_MessageCallback(IOTHUB_MESSAGE_HANDLE messageHandle,void *ctx)

{
  LOGGER_LOG p_Var1;
  IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *clientHandleData;
  LOGGER_LOG l;
  _Bool result;
  void *ctx_local;
  IOTHUB_MESSAGE_HANDLE messageHandle_local;
  
  if ((ctx == (void *)0x0) || (messageHandle == (IOTHUB_MESSAGE_HANDLE)0x0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_MessageCallback",0x2e0,1,
                "invalid argument: ctx(%p), messageHandle(%p)",ctx,messageHandle);
    }
    messageHandle_local._7_1_ = false;
  }
  else {
    messageHandle_local._7_1_ =
         invoke_message_callback((IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)ctx,messageHandle);
  }
  return messageHandle_local._7_1_;
}

Assistant:

static bool IoTHubClientCore_LL_MessageCallback(IOTHUB_MESSAGE_HANDLE messageHandle, void* ctx)
{
    bool result;
    if ((ctx == NULL) || messageHandle == NULL)
    {
        LogError("invalid argument: ctx(%p), messageHandle(%p)", ctx, messageHandle);
        result = false;
    }
    else
    {
        IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* clientHandleData = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA*)ctx;
        return invoke_message_callback(clientHandleData, messageHandle);
    }
    return result;
}